

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUISkin * __thiscall
irr::gui::CGUIEnvironment::createSkin(CGUIEnvironment *this,EGUI_SKIN_TYPE type)

{
  int iVar1;
  IGUISkin *pIVar2;
  long *plVar3;
  long *in_RDI;
  IGUISpriteBank *bank;
  IGUIFontBitmap *bitfont;
  IGUIFont *builtinfont;
  IGUISkin *skin;
  IVideoDriver *in_stack_000000c0;
  EGUI_SKIN_TYPE in_stack_000000cc;
  CGUISkin *in_stack_000000d0;
  undefined8 local_30;
  long *local_28;
  
  pIVar2 = (IGUISkin *)operator_new(0x280);
  CGUISkin::CGUISkin(in_stack_000000d0,in_stack_000000cc,in_stack_000000c0);
  plVar3 = (long *)(**(code **)(*in_RDI + 0x98))();
  local_28 = (long *)0x0;
  if (plVar3 != (long *)0x0) {
    iVar1 = (**(code **)(*plVar3 + 0x18))();
    if (iVar1 == 0) {
      local_28 = plVar3;
    }
  }
  local_30 = 0;
  (*pIVar2->_vptr_IGUISkin[7])(pIVar2,plVar3,0);
  if (local_28 != (long *)0x0) {
    local_30 = (**(code **)(*local_28 + 0x58))();
  }
  (*pIVar2->_vptr_IGUISkin[9])(pIVar2,local_30);
  return pIVar2;
}

Assistant:

IGUISkin *CGUIEnvironment::createSkin(EGUI_SKIN_TYPE type)
{
	IGUISkin *skin = new CGUISkin(type, Driver);

	IGUIFont *builtinfont = getBuiltInFont();
	IGUIFontBitmap *bitfont = 0;
	if (builtinfont && builtinfont->getType() == EGFT_BITMAP)
		bitfont = (IGUIFontBitmap *)builtinfont;

	IGUISpriteBank *bank = 0;
	skin->setFont(builtinfont);

	if (bitfont)
		bank = bitfont->getSpriteBank();

	skin->setSpriteBank(bank);

	return skin;
}